

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomColorGroup::read(DomColorGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomColorRole *pDVar2;
  char16_t *pcVar3;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QVar6 = (QStringView)QXmlStreamReader::name();
        QVar4.m_data = L"colorrole";
        QVar4.m_size = 9;
        pcVar3 = L"colorrole";
        local_48 = QVar6;
        iVar1 = QtPrivate::compareStrings(QVar6,QVar4,CaseInsensitive);
        if (iVar1 == 0) {
          pDVar2 = (DomColorRole *)operator_new(0x28);
          (pDVar2->m_attr_role).d.d = (Data *)0x0;
          (pDVar2->m_attr_role).d.ptr = (char16_t *)0x0;
          (pDVar2->m_attr_role).d.size = 0;
          pDVar2->m_has_attr_role = false;
          *(undefined3 *)&pDVar2->field_0x19 = 0;
          pDVar2->m_children = 0;
          pDVar2->m_brush = (DomBrush *)0x0;
          DomColorRole::read(pDVar2,__fd,__buf_00,(size_t)pcVar3);
          local_60.d.d = (Data *)pDVar2;
          QtPrivate::QPodArrayOps<DomColorRole*>::emplace<DomColorRole*&>
                    ((QPodArrayOps<DomColorRole*> *)&this->m_colorRole,(this->m_colorRole).d.size,
                     (DomColorRole **)&local_60);
          QList<DomColorRole_*>::end(&this->m_colorRole);
        }
        else {
          QVar5.m_data = L"color";
          QVar5.m_size = 5;
          pcVar3 = L"color";
          iVar1 = QtPrivate::compareStrings(QVar6,QVar5,CaseInsensitive);
          if (iVar1 == 0) {
            pDVar2 = (DomColorRole *)operator_new(0x18);
            (pDVar2->m_attr_role).d.d = (Data *)0x0;
            (pDVar2->m_attr_role).d.ptr = (char16_t *)0x0;
            (pDVar2->m_attr_role).d.size = 0;
            DomColor::read((DomColor *)pDVar2,__fd,__buf_01,(size_t)pcVar3);
            local_60.d.d = (Data *)pDVar2;
            QtPrivate::QPodArrayOps<DomColor*>::emplace<DomColor*&>
                      ((QPodArrayOps<DomColor*> *)&this->m_color,(this->m_color).d.size,
                       (DomColor **)&local_60);
            QList<DomColor_*>::end(&this->m_color);
          }
          else {
            local_78.a.m_size = 0x13;
            local_78.a.m_data = "Unexpected element ";
            local_78.b = &local_48;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_60,&local_78);
            QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
            if ((DomColorRole *)local_60.d.d != (DomColorRole *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColorGroup::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"colorrole"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColorRole();
                v->read(reader);
                m_colorRole.append(v);
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                m_color.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}